

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::truncate
          (ArrayBuilder<kj::Array<unsigned_char>_> *this,char *__file,__off_t __length)

{
  Array<unsigned_char> *pAVar1;
  Array<unsigned_char> *pAVar2;
  uchar *puVar3;
  size_t sVar4;
  
  pAVar1 = this->ptr;
  pAVar2 = this->pos;
  while (pAVar1 + (long)__file < pAVar2) {
    this->pos = pAVar2 + -1;
    puVar3 = pAVar2[-1].ptr;
    if (puVar3 != (uchar *)0x0) {
      sVar4 = pAVar2[-1].size_;
      pAVar2[-1].ptr = (uchar *)0x0;
      pAVar2[-1].size_ = 0;
      (*(code *)**(undefined8 **)pAVar2[-1].disposer)(pAVar2[-1].disposer,puVar3,1,sVar4,sVar4,0);
    }
    pAVar2 = this->pos;
  }
  return (int)pAVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }